

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseUnboundValueTypeList(WastParser *this,TokenType token,TypeVector *types)

{
  bool bVar1;
  Result RVar2;
  
  while( true ) {
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      return (Result)Ok;
    }
    RVar2 = ParseValueTypeList(this,types);
    if (RVar2.enum_ == Error) break;
    RVar2 = Expect(this,Rpar);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseUnboundValueTypeList(TokenType token,
                                             TypeVector* types) {
  WABT_TRACE(ParseUnboundValueTypeList);
  while (MatchLpar(token)) {
    CHECK_RESULT(ParseValueTypeList(types));
    EXPECT(Rpar);
  }
  return Result::Ok;
}